

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O3

bool __thiscall tsip::save_to_eeprom(tsip *this,int seg_num)

{
  _command_packet _cmd;
  bool bVar1;
  long lVar2;
  _command_packet *p_Var3;
  undefined8 *puVar4;
  undefined1 in_stack_ffffffffffffffb8 [64];
  
  *(undefined2 *)&this->m_command = 0x4c8e;
  (this->m_command).raw.data[2] = (UINT8)seg_num;
  (this->m_command).raw.cmd_len = '\x03';
  p_Var3 = &this->m_command;
  puVar4 = (undefined8 *)&stack0xffffffffffffffb8;
  for (lVar2 = 8; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)p_Var3;
    p_Var3 = (_command_packet *)((long)p_Var3 + 8);
    puVar4 = puVar4 + 1;
  }
  _cmd._64_4_ = *(undefined4 *)((long)&this->m_command + 0x40);
  _cmd._0_1_ = in_stack_ffffffffffffffb8[0];
  _cmd._1_1_ = in_stack_ffffffffffffffb8[1];
  _cmd._2_1_ = in_stack_ffffffffffffffb8[2];
  _cmd._3_1_ = in_stack_ffffffffffffffb8[3];
  _cmd._4_1_ = in_stack_ffffffffffffffb8[4];
  _cmd._5_1_ = in_stack_ffffffffffffffb8[5];
  _cmd._6_1_ = in_stack_ffffffffffffffb8[6];
  _cmd._7_1_ = in_stack_ffffffffffffffb8[7];
  _cmd._8_1_ = in_stack_ffffffffffffffb8[8];
  _cmd._9_1_ = in_stack_ffffffffffffffb8[9];
  _cmd._10_1_ = in_stack_ffffffffffffffb8[10];
  _cmd._11_1_ = in_stack_ffffffffffffffb8[0xb];
  _cmd._12_1_ = in_stack_ffffffffffffffb8[0xc];
  _cmd._13_1_ = in_stack_ffffffffffffffb8[0xd];
  _cmd._14_1_ = in_stack_ffffffffffffffb8[0xe];
  _cmd._15_1_ = in_stack_ffffffffffffffb8[0xf];
  _cmd._16_1_ = in_stack_ffffffffffffffb8[0x10];
  _cmd._17_1_ = in_stack_ffffffffffffffb8[0x11];
  _cmd._18_1_ = in_stack_ffffffffffffffb8[0x12];
  _cmd._19_1_ = in_stack_ffffffffffffffb8[0x13];
  _cmd._20_1_ = in_stack_ffffffffffffffb8[0x14];
  _cmd._21_1_ = in_stack_ffffffffffffffb8[0x15];
  _cmd._22_1_ = in_stack_ffffffffffffffb8[0x16];
  _cmd._23_1_ = in_stack_ffffffffffffffb8[0x17];
  _cmd._24_1_ = in_stack_ffffffffffffffb8[0x18];
  _cmd._25_1_ = in_stack_ffffffffffffffb8[0x19];
  _cmd._26_1_ = in_stack_ffffffffffffffb8[0x1a];
  _cmd._27_1_ = in_stack_ffffffffffffffb8[0x1b];
  _cmd._28_1_ = in_stack_ffffffffffffffb8[0x1c];
  _cmd._29_1_ = in_stack_ffffffffffffffb8[0x1d];
  _cmd._30_1_ = in_stack_ffffffffffffffb8[0x1e];
  _cmd._31_1_ = in_stack_ffffffffffffffb8[0x1f];
  _cmd._32_1_ = in_stack_ffffffffffffffb8[0x20];
  _cmd._33_1_ = in_stack_ffffffffffffffb8[0x21];
  _cmd._34_1_ = in_stack_ffffffffffffffb8[0x22];
  _cmd._35_1_ = in_stack_ffffffffffffffb8[0x23];
  _cmd._36_1_ = in_stack_ffffffffffffffb8[0x24];
  _cmd._37_1_ = in_stack_ffffffffffffffb8[0x25];
  _cmd._38_1_ = in_stack_ffffffffffffffb8[0x26];
  _cmd._39_1_ = in_stack_ffffffffffffffb8[0x27];
  _cmd._40_1_ = in_stack_ffffffffffffffb8[0x28];
  _cmd._41_1_ = in_stack_ffffffffffffffb8[0x29];
  _cmd._42_1_ = in_stack_ffffffffffffffb8[0x2a];
  _cmd._43_1_ = in_stack_ffffffffffffffb8[0x2b];
  _cmd._44_1_ = in_stack_ffffffffffffffb8[0x2c];
  _cmd._45_1_ = in_stack_ffffffffffffffb8[0x2d];
  _cmd._46_1_ = in_stack_ffffffffffffffb8[0x2e];
  _cmd._47_1_ = in_stack_ffffffffffffffb8[0x2f];
  _cmd._48_1_ = in_stack_ffffffffffffffb8[0x30];
  _cmd._49_1_ = in_stack_ffffffffffffffb8[0x31];
  _cmd._50_1_ = in_stack_ffffffffffffffb8[0x32];
  _cmd._51_1_ = in_stack_ffffffffffffffb8[0x33];
  _cmd._52_1_ = in_stack_ffffffffffffffb8[0x34];
  _cmd._53_1_ = in_stack_ffffffffffffffb8[0x35];
  _cmd._54_1_ = in_stack_ffffffffffffffb8[0x36];
  _cmd._55_1_ = in_stack_ffffffffffffffb8[0x37];
  _cmd._56_1_ = in_stack_ffffffffffffffb8[0x38];
  _cmd._57_1_ = in_stack_ffffffffffffffb8[0x39];
  _cmd._58_1_ = in_stack_ffffffffffffffb8[0x3a];
  _cmd._59_1_ = in_stack_ffffffffffffffb8[0x3b];
  _cmd._60_1_ = in_stack_ffffffffffffffb8[0x3c];
  _cmd._61_1_ = in_stack_ffffffffffffffb8[0x3d];
  _cmd._62_1_ = in_stack_ffffffffffffffb8[0x3e];
  _cmd._63_1_ = in_stack_ffffffffffffffb8[0x3f];
  bVar1 = send_request_msg(this,_cmd);
  return bVar1;
}

Assistant:

bool tsip::save_to_eeprom(int seg_num=0xff) {
	bool rc;

	//build 8E- request - set autosave
	m_command.extended.code = COMMAND_SUPER_PACKET;
	m_command.extended.subcode = COMMAND_SAVE_EEPROM ;
	m_command.extended.data[0] = seg_num;

	m_command.extended.cmd_len = 3;

	rc = send_request_msg(m_command);
	return rc;
}